

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf.cpp
# Opt level: O1

MPP_RET mpp_dmabuf_sync_partial_end(RK_S32 fd,RK_S32 ro,RK_U32 offset,RK_U32 length,char *caller)

{
  bool bVar1;
  int iVar2;
  MPP_RET MVar3;
  int *piVar4;
  char *pcVar5;
  dma_buf_sync_partial sync;
  long local_38;
  uint local_30;
  uint local_2c;
  
  if (has_partial_ops != 0) {
    bVar1 = true;
    if (length == 0) {
      MVar3 = MPP_OK;
    }
    else {
      local_38 = (ulong)(ro == 0) * 2 + 5;
      local_30 = offset & 0xffffffc0;
      local_2c = ((length + offset) - local_30) + 0x3f & 0xffffffc0;
      iVar2 = ioctl(fd,0x40106202,&local_38);
      MVar3 = MPP_OK;
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        if (*piVar4 == 0x19) {
          has_partial_ops = 0;
          bVar1 = false;
          MVar3 = MPP_OK;
        }
        else {
          pcVar5 = strerror(*piVar4);
          _mpp_log_l(2,(char *)0x0,"ioctl failed for %s from %s\n","mpp_dmabuf_sync_partial_end",
                     pcVar5,caller);
          MVar3 = MPP_NOK;
        }
      }
    }
    if (bVar1) {
      return MVar3;
    }
  }
  MVar3 = mpp_dmabuf_sync_end(fd,ro,caller);
  return MVar3;
}

Assistant:

MPP_RET mpp_dmabuf_sync_partial_end(RK_S32 fd, RK_S32 ro, RK_U32 offset, RK_U32 length, const char *caller)
{
    if (has_partial_ops) {
        struct dma_buf_sync_partial sync;
        RK_S32 ret;

        if (!length)
            return MPP_OK;

        sync.flags = DMA_BUF_SYNC_END | (ro ? DMA_BUF_SYNC_READ : DMA_BUF_SYNC_RW);
        sync.offset = MPP_ALIGN_DOWN(offset, CACHE_LINE_SIZE);
        sync.len = MPP_ALIGN(length + offset - sync.offset, CACHE_LINE_SIZE);

        ret = ioctl(fd, DMA_BUF_IOCTL_SYNC_PARTIAL, &sync);
        if (ret) {
            if (errno == MPP_NO_PARTIAL_SUPPORT) {
                has_partial_ops = 0;
                goto NOT_SUPPORT;
            }

            mpp_err_f("ioctl failed for %s from %s\n", strerror(errno), caller);
            return MPP_NOK;
        }

        return MPP_OK;
    }

NOT_SUPPORT:
    return mpp_dmabuf_sync_end(fd, ro, caller);
}